

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rock_sample.cpp
# Opt level: O0

double __thiscall
despot::RockSample::ObsProb(RockSample *this,OBS_TYPE obs,State *state,ACT_TYPE action)

{
  bool bVar1;
  undefined8 uVar2;
  const_reference pvVar3;
  double dVar4;
  __type _Var5;
  RockSample *local_80;
  RockSample *local_70;
  double efficiency;
  double distance;
  int rock;
  RockSampleState *rockstate;
  ACT_TYPE action_local;
  State *state_local;
  OBS_TYPE obs_local;
  RockSample *this_local;
  
  if (action < 5) {
    local_70 = (RockSample *)0x3ff0000000000000;
    if (obs != 2) {
      local_70 = (RockSample *)0x0;
    }
    this_local = local_70;
  }
  else if ((obs == 1) || (obs == 0)) {
    uVar2 = BaseRockSample::GetRobPos(&this->super_BaseRockSample,state);
    pvVar3 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&(this->super_BaseRockSample).rock_pos_,(long)(action + -5));
    dVar4 = (double)despot::Coord::EuclideanDistance(uVar2,*(undefined8 *)pvVar3);
    _Var5 = std::pow<int,double>(2,-dVar4 / (this->super_BaseRockSample).half_efficiency_distance_);
    local_80 = (RockSample *)((_Var5 + 1.0) * 0.5);
    bVar1 = BaseRockSample::GetRock(&this->super_BaseRockSample,state,action + -5);
    if ((long)(int)(uint)bVar1 != obs) {
      local_80 = (RockSample *)(1.0 - (double)local_80);
    }
    this_local = local_80;
  }
  else {
    this_local = (RockSample *)0x0;
  }
  return (double)this_local;
}

Assistant:

double RockSample::ObsProb(OBS_TYPE obs, const State& state, ACT_TYPE action) const {
	if (action <= E_SAMPLE)
		return obs == E_NONE;

	if (obs != E_GOOD && obs != E_BAD)
		return 0;

	const RockSampleState& rockstate =
		static_cast<const RockSampleState&>(state);

	int rock = action - E_SAMPLE - 1;
	double distance = Coord::EuclideanDistance(GetRobPos(&rockstate),
		rock_pos_[rock]);
	double efficiency = (1 + pow(2, -distance / half_efficiency_distance_))
		* 0.5;

	return
		((GetRock(&rockstate, rock) & 1) == obs) ? efficiency : (1 - efficiency);
}